

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedFileWriter.cpp
# Opt level: O1

void __thiscall BufferedFileWriter::~BufferedFileWriter(BufferedFileWriter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  WriterData writerData;
  WriterData WStack_38;
  
  terminate(this);
  while( true ) {
    bVar3 = SafeQueue<WriterData>::empty((SafeQueue<WriterData> *)&this->m_writeQueue);
    if (bVar3) break;
    WaitableSafeQueue<WriterData>::pop(&WStack_38,&this->m_writeQueue);
    WriterData::execute(&WStack_38);
  }
  (this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.super_SafeQueue<WriterData>.
  _vptr_SafeQueue = (_func_int **)&PTR__WaitableSafeQueue_0023ff68;
  std::condition_variable::~condition_variable(&(this->m_writeQueue).m_cond);
  (this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.super_SafeQueue<WriterData>.
  _vptr_SafeQueue = (_func_int **)&PTR__SafeQueue_00240008;
  std::_Deque_base<WriterData,_std::allocator<WriterData>_>::~_Deque_base
            ((_Deque_base<WriterData,_std::allocator<WriterData>_> *)
             &(this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.
              super_SafeQueue<WriterData>.m_queue);
  pcVar2 = (this->m_lastErrorStr)._M_dataplus._M_p;
  paVar1 = &(this->m_lastErrorStr).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  TerminatableThread::~TerminatableThread(&this->super_TerminatableThread);
  return;
}

Assistant:

BufferedFileWriter::~BufferedFileWriter()
{
    terminate();
    while (!m_writeQueue.empty())
    {
        WriterData writerData = m_writeQueue.pop();
        writerData.execute();
    }
}